

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void AArch64_printInst(MCInst *MI,SStream *O,void *Info)

{
  byte bVar1;
  ushort uVar2;
  cs_struct *pcVar3;
  cs_detail *pcVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  arm64_reg aVar9;
  MCOperand *pMVar10;
  MCOperand *pMVar11;
  MCOperand *pMVar12;
  MCOperand *pMVar13;
  int64_t iVar14;
  int64_t iVar15;
  ulong uVar16;
  int64_t iVar17;
  uint8_t *puVar18;
  char *pcVar19;
  cs_insn *pcVar20;
  uint8_t uVar21;
  int iVar22;
  undefined **ppuVar23;
  int iVar24;
  uint uVar25;
  uint val;
  char *pcVar26;
  uint16_t *RegAsmOffset;
  uint16_t *RegAsmOffset_2;
  int iVar27;
  char *AsmStrs_1;
  uint16_t *RegAsmOffset_1;
  int iVar28;
  char *AsmStrs;
  bool bVar29;
  bool bVar30;
  
  uVar6 = MCInst_getOpcode(MI);
  if (uVar6 != 0x7c4) goto LAB_001fe669;
  pMVar10 = MCInst_getOperand(MI,0);
  pMVar11 = MCInst_getOperand(MI,1);
  pMVar12 = MCInst_getOperand(MI,2);
  pMVar13 = MCInst_getOperand(MI,3);
  iVar14 = MCOperand_getImm(pMVar10);
  iVar15 = MCOperand_getImm(pMVar11);
  uVar16 = MCOperand_getImm(pMVar12);
  iVar17 = MCOperand_getImm(pMVar13);
  iVar28 = (int)iVar14;
  uVar7 = (uint)iVar17;
  if ((int)iVar15 == 8) {
    iVar22 = 0;
    pcVar26 = (char *)0x0;
    uVar25 = 0;
    iVar27 = 0;
    iVar24 = 0;
    uVar8 = 0;
    switch(uVar16 & 0xffffffff) {
    case 0:
      if (iVar28 != 4) break;
      if (uVar7 == 5) {
        pcVar26 = "tlbi\tipas2le1is";
        uVar8 = 0x1c3;
        iVar27 = 0x10;
      }
      else {
        if (uVar7 != 1) break;
        pcVar26 = "tlbi\tipas2e1is";
        uVar8 = 0x1c3;
        iVar27 = 0xf;
      }
LAB_001fe469:
      iVar22 = 0;
      uVar25 = 0;
      goto LAB_001fe46c;
    case 1:
    case 2:
    case 5:
    case 6:
      goto switchD_001fe061_caseD_1;
    case 3:
      if (iVar28 == 6) {
        if (uVar7 < 6) {
          uVar16 = (ulong)(uVar7 & 7);
          uVar7 = (uVar7 & 7) * 4;
          iVar27 = *(int *)(&DAT_003bc464 + uVar7);
          uVar8 = *(uint *)(&DAT_003bc4cc + uVar7);
          ppuVar23 = &PTR_anon_var_dwarf_371217_00655dd8;
          goto LAB_001fe465;
        }
      }
      else if (iVar28 == 4) {
        if (uVar7 < 7) {
          uVar16 = (ulong)(uVar7 & 7);
          uVar7 = (uVar7 & 7) * 4;
          iVar27 = *(int *)(&DAT_003bc448 + uVar7);
          uVar8 = *(uint *)(&DAT_003bc498 + uVar7);
          ppuVar23 = &PTR_anon_var_dwarf_3711d4_00655da0;
          goto LAB_001fe465;
        }
      }
      else if ((iVar28 == 0) && (uVar7 < 8)) {
        uVar16 = (ulong)(uVar7 & 7);
        uVar7 = (uVar7 & 7) * 4;
        iVar27 = *(int *)(&DAT_003bdef4 + uVar7);
        uVar8 = *(uint *)(&DAT_003bdf34 + uVar7);
        ppuVar23 = &PTR_anon_var_dwarf_371186_00655d60;
LAB_001fe465:
        pcVar26 = ppuVar23[uVar16];
        goto LAB_001fe469;
      }
      break;
    case 4:
      if (iVar28 == 4) {
        if (uVar7 == 5) {
          pcVar26 = "tlbi\tipas2le1";
          uVar8 = 0x1c3;
          iVar27 = 0x12;
        }
        else {
          if (uVar7 != 1) break;
          pcVar26 = "tlbi\tipas2e1";
          uVar8 = 0x1c3;
          iVar27 = 0x11;
        }
        goto LAB_001fe469;
      }
      break;
    case 7:
      if (iVar28 == 6) {
        if (uVar7 < 6) {
          uVar16 = (ulong)(uVar7 & 7);
          uVar7 = (uVar7 & 7) * 4;
          iVar27 = *(int *)(&DAT_003bc4b4 + uVar7);
          uVar8 = *(uint *)(&DAT_003bc4cc + uVar7);
          ppuVar23 = &PTR_anon_var_dwarf_3712e9_00655e80;
          goto LAB_001fe465;
        }
      }
      else if (iVar28 == 4) {
        if (uVar7 < 7) {
          uVar16 = (ulong)(uVar7 & 7);
          uVar7 = (uVar7 & 7) * 4;
          iVar27 = *(int *)(&DAT_003bc47c + uVar7);
          uVar8 = *(uint *)(&DAT_003bc498 + uVar7);
          ppuVar23 = &PTR_anon_var_dwarf_3712b2_00655e48;
          goto LAB_001fe465;
        }
      }
      else if ((iVar28 == 0) && (uVar7 < 8)) {
        uVar16 = (ulong)(uVar7 & 7);
        uVar7 = (uVar7 & 7) * 4;
        iVar27 = *(int *)(&DAT_003bdf14 + uVar7);
        uVar8 = *(uint *)(&DAT_003bdf34 + uVar7);
        ppuVar23 = &PTR_anon_var_dwarf_371270_00655e08;
        goto LAB_001fe465;
      }
      break;
    default:
      uVar25 = 0;
      iVar27 = 0;
      iVar24 = 0;
      uVar8 = 0;
      goto switchD_001fe061_caseD_1;
    }
    goto LAB_001fe2ee;
  }
  if ((int)iVar15 != 7) goto LAB_001fe2ee;
  switch((int)uVar16) {
  case 1:
    if (iVar28 != 0 || uVar7 != 0) goto LAB_001fe2ee;
    pcVar26 = "ic\tialluis";
    iVar24 = 1;
    goto LAB_001fe367;
  case 4:
    if (uVar7 == 1 && iVar28 == 3) {
      pcVar26 = "dc\tzva";
      uVar8 = 0x1c1;
      iVar22 = 1;
      goto LAB_001fe374;
    }
    break;
  case 5:
    if (iVar28 == 0 && uVar7 == 0) {
      pcVar26 = "ic\tiallu";
      iVar24 = 2;
    }
    else {
      if (uVar7 != 1 || iVar28 != 3) goto LAB_001fe2ee;
      pcVar26 = "ic\tivau";
      iVar24 = 3;
    }
LAB_001fe367:
    iVar22 = 0;
    uVar25 = 0;
    uVar8 = 0x1c0;
    iVar27 = 0;
    goto switchD_001fe061_caseD_1;
  case 6:
    bVar30 = iVar28 == 0;
    bVar29 = uVar7 == 1;
    uVar25 = 0;
    uVar8 = 0;
    if (bVar29 && bVar30) {
      uVar8 = 0x1c1;
    }
    pcVar26 = "dc\tivac";
    if (!bVar29 || !bVar30) {
      pcVar26 = (char *)0x0;
    }
    if (uVar7 == 2 && bVar30) {
      pcVar26 = "dc\tisw";
      iVar22 = 3;
      iVar27 = 0;
      iVar24 = 0;
      uVar8 = 0x1c1;
      goto switchD_001fe061_caseD_1;
    }
    iVar22 = (uint)(bVar29 && bVar30) * 2;
    goto LAB_001fe374;
  case 8:
    if (iVar28 != 6) {
      if (iVar28 == 4) {
        iVar22 = 0;
        if (uVar7 < 8) {
          uVar8 = (uVar7 & 7) * 4;
          uVar25 = *(uint *)(&DAT_003bdeb4 + uVar8);
          uVar8 = *(uint *)(&DAT_003bded4 + uVar8);
          pcVar26 = (&PTR_anon_var_dwarf_37112e_00655d20)[uVar7 & 7];
          goto LAB_001fe378;
        }
      }
      else if ((iVar28 == 0) && (iVar22 = 0, uVar7 < 4)) {
        pcVar26 = &DAT_003bc438 + *(int *)(&DAT_003bc438 + (ulong)(uVar7 & 3) * 4);
        uVar8 = 0x1c2;
        uVar25 = uVar7;
        goto LAB_001fe378;
      }
      goto LAB_001fe2ee;
    }
    if (uVar7 == 1) {
      iVar22 = 0;
      pcVar26 = "at\ts1e3w";
      uVar8 = 0x1c2;
      uVar25 = 0xb;
    }
    else {
      iVar22 = 0;
      if (uVar7 != 0) goto LAB_001fe2ee;
      pcVar26 = "at\ts1e3r";
      uVar8 = 0x1c2;
      uVar25 = 10;
    }
    goto LAB_001fe378;
  case 10:
    uVar8 = 0x1c1;
    if (uVar7 == 1 && iVar28 == 3) {
      pcVar26 = "dc\tcvac";
      iVar22 = 4;
    }
    else {
      if (iVar28 != 0 || uVar7 != 2) break;
      pcVar26 = "dc\tcsw";
      iVar22 = 5;
    }
    goto LAB_001fe374;
  case 0xb:
    if (uVar7 == 1 && iVar28 == 3) {
      pcVar26 = "dc\tcvau";
      uVar8 = 0x1c1;
      iVar22 = 6;
      goto LAB_001fe374;
    }
    break;
  case 0xe:
    uVar8 = 0x1c1;
    if (uVar7 == 1 && iVar28 == 3) {
      pcVar26 = "dc\tcivac";
      iVar22 = 7;
    }
    else {
      if (iVar28 != 0 || uVar7 != 2) break;
      pcVar26 = "dc\tcisw";
      iVar22 = 8;
    }
LAB_001fe374:
    uVar25 = 0;
LAB_001fe378:
    iVar27 = 0;
LAB_001fe46c:
    iVar24 = 0;
    goto switchD_001fe061_caseD_1;
  }
LAB_001fe2ee:
  iVar22 = 0;
  uVar25 = 0;
  iVar27 = 0;
  iVar24 = 0;
  uVar8 = 0;
  pcVar26 = (char *)0x0;
switchD_001fe061_caseD_1:
  if (pcVar26 != (char *)0x0) {
    MCInst_setOpcodePub(MI,uVar8);
    SStream_concat0(O,pcVar26);
    pcVar3 = MI->csh;
    if (pcVar3->detail != CS_OPT_OFF) {
      uVar7 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar7);
      uVar21 = '\0';
      if (puVar18[bVar1] != 0x80) {
        uVar21 = puVar18[bVar1];
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = 'D';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           iVar27 + iVar24 + uVar25 + iVar22;
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
    }
    pcVar19 = strstr(pcVar26,"all");
    if (pcVar19 == (char *)0x0) {
      pMVar10 = MCInst_getOperand(MI,4);
      uVar7 = MCOperand_getReg(pMVar10);
      SStream_concat(O,", %s",getRegisterName_AsmStrsNoRegAltName +
                              *(ushort *)
                               (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar7 - 1) * 2));
      pcVar3 = MI->csh;
      if (pcVar3->detail != CS_OPT_OFF) {
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar18 = AArch64_get_op_access(pcVar3,uVar8);
        uVar21 = '\0';
        if (puVar18[bVar1] != 0x80) {
          uVar21 = puVar18[bVar1];
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar18[0] = '\x01';
        puVar18[1] = '\0';
        puVar18[2] = '\0';
        puVar18[3] = '\0';
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar7;
        puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar18 = *puVar18 + '\x01';
      }
    }
    if (pcVar26 != (char *)0x0) {
      return;
    }
  }
LAB_001fe669:
  uVar7 = uVar6 & 0xfffffffe;
  bVar30 = uVar7 != 0x502;
  if ((uVar6 - 0x820 < 2) || (uVar6 - 0x502 < 2)) {
    pMVar10 = MCInst_getOperand(MI,0);
    pMVar11 = MCInst_getOperand(MI,1);
    pMVar12 = MCInst_getOperand(MI,2);
    pMVar13 = MCInst_getOperand(MI,3);
    _Var5 = MCOperand_isImm(pMVar12);
    if ((_Var5) &&
       ((iVar14 = MCOperand_getImm(pMVar12), iVar14 == 0 &&
        (_Var5 = MCOperand_isImm(pMVar13), _Var5)))) {
      iVar14 = MCOperand_getImm(pMVar13);
      bVar29 = true;
      if (iVar14 == 0x1f) {
        if ((uVar6 == 0x821) || (uVar6 == 0x503)) {
          pcVar26 = (char *)0x0;
          if (uVar7 == 0x502) {
            pcVar26 = "sxtw";
          }
        }
        else {
LAB_001feedf:
          pcVar26 = (char *)0x0;
          bVar30 = bVar29;
        }
      }
      else {
        if (iVar14 == 0xf) {
          if (uVar7 == 0x502) {
            pcVar26 = "sxth";
          }
          else {
            pcVar26 = (char *)0x0;
            bVar30 = bVar29;
            if ((uVar6 == 0x503) || (uVar6 == 0x821)) goto LAB_001feef5;
            pcVar26 = "uxth";
          }
        }
        else {
          if (iVar14 != 7) goto LAB_001feedf;
          if (uVar7 == 0x502) {
            pcVar26 = "sxtb";
          }
          else {
            pcVar26 = (char *)0x0;
            bVar30 = true;
            if ((uVar6 == 0x503) || (bVar30 = bVar29, uVar6 == 0x821)) goto LAB_001feef5;
            pcVar26 = "uxtb";
          }
        }
        bVar30 = false;
      }
LAB_001feef5:
      if (!bVar30) {
        uVar8 = MCOperand_getReg(pMVar10);
        uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2);
        uVar8 = MCOperand_getReg(pMVar11);
        uVar8 = getWRegFromXReg(uVar8);
        SStream_concat(O,"%s\t%s, %s",pcVar26,getRegisterName_AsmStrsNoRegAltName + uVar2,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(ushort *)
                        (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2));
        pcVar3 = MI->csh;
        if (pcVar3->detail != CS_OPT_OFF) {
          uVar8 = MCInst_getOpcode(MI);
          bVar1 = MI->ac_idx;
          puVar18 = AArch64_get_op_access(pcVar3,uVar8);
          uVar21 = puVar18[bVar1];
          if (puVar18[bVar1] == 0x80) {
            uVar21 = '\0';
          }
          pcVar4 = MI->flat_insn->detail;
          pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
          MI->ac_idx = MI->ac_idx + '\x01';
          pcVar4 = MI->flat_insn->detail;
          puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar18[0] = '\x01';
          puVar18[1] = '\0';
          puVar18[2] = '\0';
          puVar18[3] = '\0';
          uVar8 = MCOperand_getReg(pMVar10);
          pcVar4 = MI->flat_insn->detail;
          *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
          puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar18 = *puVar18 + '\x01';
          pcVar3 = MI->csh;
          uVar8 = MCInst_getOpcode(MI);
          bVar1 = MI->ac_idx;
          puVar18 = AArch64_get_op_access(pcVar3,uVar8);
          uVar21 = puVar18[bVar1];
          if (puVar18[bVar1] == 0x80) {
            uVar21 = '\0';
          }
          pcVar4 = MI->flat_insn->detail;
          pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
          MI->ac_idx = MI->ac_idx + '\x01';
          pcVar4 = MI->flat_insn->detail;
          puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar18[0] = '\x01';
          puVar18[1] = '\0';
          puVar18[2] = '\0';
          puVar18[3] = '\0';
          uVar8 = MCOperand_getReg(pMVar11);
          uVar8 = getWRegFromXReg(uVar8);
          pcVar4 = MI->flat_insn->detail;
          *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
          puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar18 = *puVar18 + '\x01';
        }
        aVar9 = AArch64_map_insn(pcVar26);
        MCInst_setOpcodePub(MI,aVar9);
        if (!bVar30) {
          return;
        }
      }
    }
    _Var5 = MCOperand_isImm(pMVar12);
    if ((_Var5) && (_Var5 = MCOperand_isImm(pMVar13), _Var5)) {
      iVar14 = MCOperand_getImm(pMVar12);
      iVar15 = MCOperand_getImm(pMVar13);
      uVar8 = (uint)iVar15;
      val = (uint)iVar14;
      uVar25 = uVar8 + 1 ^ val;
      if (((uVar6 ^ 0x820) == 0 && uVar25 == 0) && uVar8 != 0x1f) {
        iVar28 = 0x1f;
LAB_001ff179:
        val = iVar28 - uVar8;
        pcVar26 = "lsl";
LAB_001ff182:
        bVar30 = false;
      }
      else {
        if ((uVar25 == 0 && (uVar6 ^ 0x821) == 0) && uVar8 != 0x3f) {
          iVar28 = 0x3f;
          goto LAB_001ff179;
        }
        pcVar26 = "lsr";
        if (((((uVar6 ^ 0x820) == 0 && (uVar8 ^ 0x1f) == 0) ||
             ((uVar6 ^ 0x821) == 0 && (uVar8 ^ 0x3f) == 0)) ||
            (pcVar26 = "asr", uVar6 == 0x502 && (uVar8 ^ 0x1f) == 0)) ||
           (uVar6 == 0x503 && (uVar8 ^ 0x3f) == 0)) goto LAB_001ff182;
        bVar30 = true;
        val = 0;
        pcVar26 = (char *)0x0;
      }
      if (!bVar30) {
        uVar8 = MCOperand_getReg(pMVar10);
        uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2);
        uVar8 = MCOperand_getReg(pMVar11);
        SStream_concat(O,"%s\t%s, %s, ",pcVar26,getRegisterName_AsmStrsNoRegAltName + uVar2,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(ushort *)
                        (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2));
        printInt32Bang(O,val);
        aVar9 = AArch64_map_insn(pcVar26);
        MCInst_setOpcodePub(MI,aVar9);
        pcVar3 = MI->csh;
        if (pcVar3->detail != CS_OPT_OFF) {
          uVar8 = MCInst_getOpcode(MI);
          bVar1 = MI->ac_idx;
          puVar18 = AArch64_get_op_access(pcVar3,uVar8);
          uVar21 = puVar18[bVar1];
          if (puVar18[bVar1] == 0x80) {
            uVar21 = '\0';
          }
          pcVar4 = MI->flat_insn->detail;
          pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
          MI->ac_idx = MI->ac_idx + '\x01';
          pcVar4 = MI->flat_insn->detail;
          puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar18[0] = '\x01';
          puVar18[1] = '\0';
          puVar18[2] = '\0';
          puVar18[3] = '\0';
          uVar8 = MCOperand_getReg(pMVar10);
          pcVar4 = MI->flat_insn->detail;
          *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
          puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar18 = *puVar18 + '\x01';
          pcVar3 = MI->csh;
          uVar8 = MCInst_getOpcode(MI);
          bVar1 = MI->ac_idx;
          puVar18 = AArch64_get_op_access(pcVar3,uVar8);
          uVar21 = puVar18[bVar1];
          if (puVar18[bVar1] == 0x80) {
            uVar21 = '\0';
          }
          pcVar4 = MI->flat_insn->detail;
          pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
          MI->ac_idx = MI->ac_idx + '\x01';
          pcVar4 = MI->flat_insn->detail;
          puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar18[0] = '\x01';
          puVar18[1] = '\0';
          puVar18[2] = '\0';
          puVar18[3] = '\0';
          uVar8 = MCOperand_getReg(pMVar11);
          pcVar4 = MI->flat_insn->detail;
          *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
          puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar18 = *puVar18 + '\x01';
          pcVar3 = MI->csh;
          uVar8 = MCInst_getOpcode(MI);
          bVar1 = MI->ac_idx;
          puVar18 = AArch64_get_op_access(pcVar3,uVar8);
          uVar21 = puVar18[bVar1];
          if (puVar18[bVar1] == 0x80) {
            uVar21 = '\0';
          }
          pcVar4 = MI->flat_insn->detail;
          pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
          MI->ac_idx = MI->ac_idx + '\x01';
          pcVar4 = MI->flat_insn->detail;
          puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar18[0] = '\x02';
          puVar18[1] = '\0';
          puVar18[2] = '\0';
          puVar18[3] = '\0';
          pcVar4 = MI->flat_insn->detail;
          *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
               (long)(int)val;
          puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar18 = *puVar18 + '\x01';
        }
        if (!bVar30) {
          return;
        }
      }
    }
    iVar14 = MCOperand_getImm(pMVar12);
    iVar15 = MCOperand_getImm(pMVar13);
    uVar8 = MCOperand_getReg(pMVar10);
    uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2);
    uVar8 = MCOperand_getReg(pMVar11);
    if (iVar15 < iVar14) {
      pcVar26 = "sbfiz";
      if (uVar7 != 0x502) {
        pcVar26 = "ubfiz";
      }
      SStream_concat(O,"%s\t%s, %s, ",pcVar26,getRegisterName_AsmStrsNoRegAltName + uVar2,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2))
      ;
      iVar28 = (uint)(uVar6 == 0x503 || uVar6 == 0x821) * 0x20 + 0x20;
      iVar14 = MCOperand_getImm(pMVar12);
      printInt32Bang(O,iVar28 - (int)iVar14);
      SStream_concat0(O,", ");
      iVar14 = MCOperand_getImm(pMVar13);
      printInt32Bang(O,(int)iVar14 + 1);
      aVar9 = AArch64_map_insn(pcVar26);
      MCInst_setOpcodePub(MI,aVar9);
      pcVar3 = MI->csh;
      if (pcVar3->detail == CS_OPT_OFF) {
        return;
      }
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (puVar18[bVar1] == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x01';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      uVar6 = MCOperand_getReg(pMVar10);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (uVar21 == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x01';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      uVar6 = MCOperand_getReg(pMVar11);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (uVar21 == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x02';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      iVar14 = MCOperand_getImm(pMVar12);
      pcVar4 = MI->flat_insn->detail;
      *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           (long)(iVar28 - (int)iVar14);
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (uVar21 == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x02';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      iVar14 = MCOperand_getImm(pMVar13);
      pcVar4 = MI->flat_insn->detail;
      *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           iVar14 + 1;
      pcVar20 = MI->flat_insn;
      goto LAB_001ffb0d;
    }
    pcVar26 = "sbfx";
    if (uVar7 != 0x502) {
      pcVar26 = "ubfx";
    }
    SStream_concat(O,"%s\t%s, %s, ",pcVar26,getRegisterName_AsmStrsNoRegAltName + uVar2,
                   getRegisterName_AsmStrsNoRegAltName +
                   *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2));
    iVar14 = MCOperand_getImm(pMVar12);
    printInt32Bang(O,(int32_t)iVar14);
    SStream_concat0(O,", ");
    iVar14 = MCOperand_getImm(pMVar13);
    iVar15 = MCOperand_getImm(pMVar12);
    printInt32Bang(O,((int)iVar14 - (int)iVar15) + 1);
    aVar9 = AArch64_map_insn(pcVar26);
    MCInst_setOpcodePub(MI,aVar9);
    pcVar3 = MI->csh;
    if (pcVar3->detail == CS_OPT_OFF) {
      return;
    }
    uVar6 = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar18 = AArch64_get_op_access(pcVar3,uVar6);
    uVar21 = puVar18[bVar1];
    if (puVar18[bVar1] == 0x80) {
      uVar21 = '\0';
    }
    pcVar4 = MI->flat_insn->detail;
    pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar4 = MI->flat_insn->detail;
    puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar18[0] = '\x01';
    puVar18[1] = '\0';
    puVar18[2] = '\0';
    puVar18[3] = '\0';
    uVar6 = MCOperand_getReg(pMVar10);
    pcVar4 = MI->flat_insn->detail;
    *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
    puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar18 = *puVar18 + '\x01';
    pcVar3 = MI->csh;
    uVar6 = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar18 = AArch64_get_op_access(pcVar3,uVar6);
    uVar21 = puVar18[bVar1];
    if (uVar21 == 0x80) {
      uVar21 = '\0';
    }
    pcVar4 = MI->flat_insn->detail;
    pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar4 = MI->flat_insn->detail;
    puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar18[0] = '\x01';
    puVar18[1] = '\0';
    puVar18[2] = '\0';
    puVar18[3] = '\0';
    uVar6 = MCOperand_getReg(pMVar11);
    pcVar4 = MI->flat_insn->detail;
    *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
    puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar18 = *puVar18 + '\x01';
    pcVar3 = MI->csh;
    uVar6 = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar18 = AArch64_get_op_access(pcVar3,uVar6);
    uVar21 = puVar18[bVar1];
    if (uVar21 == 0x80) {
      uVar21 = '\0';
    }
    pcVar4 = MI->flat_insn->detail;
    pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar4 = MI->flat_insn->detail;
    puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar18[0] = '\x02';
    puVar18[1] = '\0';
    puVar18[2] = '\0';
    puVar18[3] = '\0';
    iVar14 = MCOperand_getImm(pMVar12);
    pcVar4 = MI->flat_insn->detail;
    *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = iVar14;
    puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar18 = *puVar18 + '\x01';
    pcVar3 = MI->csh;
    uVar6 = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar18 = AArch64_get_op_access(pcVar3,uVar6);
    uVar21 = puVar18[bVar1];
    if (uVar21 == 0x80) {
      uVar21 = '\0';
    }
    pcVar4 = MI->flat_insn->detail;
    pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar4 = MI->flat_insn->detail;
    puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar18[0] = '\x02';
    puVar18[1] = '\0';
    puVar18[2] = '\0';
    puVar18[3] = '\0';
    iVar14 = MCOperand_getImm(pMVar13);
    iVar15 = MCOperand_getImm(pMVar12);
    pcVar4 = MI->flat_insn->detail;
    *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
         (iVar14 - iVar15) + 1;
  }
  else {
    if (uVar7 != 0x68) {
      pcVar26 = printAliasInstr(MI,O,Info);
      if (pcVar26 == (char *)0x0) {
        printInstruction(MI,O,(MCRegisterInfo *)Info);
        return;
      }
      aVar9 = AArch64_map_insn(pcVar26);
      MCInst_setOpcodePub(MI,aVar9);
      (*cs_mem_free)(pcVar26);
      return;
    }
    pMVar10 = MCInst_getOperand(MI,0);
    pMVar11 = MCInst_getOperand(MI,2);
    pMVar12 = MCInst_getOperand(MI,3);
    iVar14 = MCOperand_getImm(pMVar12);
    pMVar12 = MCInst_getOperand(MI,4);
    iVar15 = MCOperand_getImm(pMVar12);
    iVar28 = (int)iVar15;
    iVar27 = (int)iVar14;
    if (iVar28 < iVar27) {
      iVar22 = (uint)(uVar6 == 0x69) * 0x20 + 0x20;
      iVar22 = (iVar22 - iVar27) % iVar22;
      iVar28 = iVar28 + 1;
      uVar6 = MCOperand_getReg(pMVar10);
      uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2);
      uVar6 = MCOperand_getReg(pMVar11);
      SStream_concat(O,"bfi\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar2,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2))
      ;
      printInt32Bang(O,iVar22);
      SStream_concat0(O,", ");
      printInt32Bang(O,iVar28);
      aVar9 = AArch64_map_insn("bfi");
      MCInst_setOpcodePub(MI,aVar9);
      pcVar3 = MI->csh;
      if (pcVar3->detail == CS_OPT_OFF) {
        return;
      }
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (puVar18[bVar1] == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x01';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      uVar6 = MCOperand_getReg(pMVar10);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (puVar18[bVar1] == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x01';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      uVar6 = MCOperand_getReg(pMVar11);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (puVar18[bVar1] == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x02';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           (long)iVar22;
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (uVar21 == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x02';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
    }
    else {
      iVar28 = (iVar28 - iVar27) + 1;
      uVar6 = MCOperand_getReg(pMVar10);
      uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2);
      uVar6 = MCOperand_getReg(pMVar11);
      SStream_concat(O,"bfxil\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar2,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2))
      ;
      printInt32Bang(O,iVar27);
      SStream_concat0(O,", ");
      printInt32Bang(O,iVar28);
      aVar9 = AArch64_map_insn("bfxil");
      MCInst_setOpcodePub(MI,aVar9);
      pcVar3 = MI->csh;
      if (pcVar3->detail == CS_OPT_OFF) {
        return;
      }
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (puVar18[bVar1] == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x01';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      uVar6 = MCOperand_getReg(pMVar10);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (puVar18[bVar1] == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x01';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      uVar6 = MCOperand_getReg(pMVar11);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (puVar18[bVar1] == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x02';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           (long)iVar27;
      puVar18 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar18 = *puVar18 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar18 = AArch64_get_op_access(pcVar3,uVar6);
      uVar21 = puVar18[bVar1];
      if (uVar21 == 0x80) {
        uVar21 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar21;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar18 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar18[0] = '\x02';
      puVar18[1] = '\0';
      puVar18[2] = '\0';
      puVar18[3] = '\0';
    }
    pcVar4 = MI->flat_insn->detail;
    *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = (long)iVar28;
  }
  pcVar20 = MI->flat_insn;
LAB_001ffb0d:
  puVar18 = (pcVar20->detail->field_6).x86.opcode + 2;
  *puVar18 = *puVar18 + '\x01';
  return;
}

Assistant:

void AArch64_printInst(MCInst *MI, SStream *O, void *Info)
{
	// Check for special encodings and print the canonical alias instead.
	unsigned Opcode = MCInst_getOpcode(MI);
	int LSB;
	int Width;
	char *mnem;

	if (Opcode == AArch64_SYSxt && printSysAlias(MI, O))
		return;

	// SBFM/UBFM should print to a nicer aliased form if possible.
	if (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri ||
			Opcode == AArch64_UBFMXri || Opcode == AArch64_UBFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0);
		MCOperand *Op1 = MCInst_getOperand(MI, 1);
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		MCOperand *Op3 = MCInst_getOperand(MI, 3);

		bool IsSigned = (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri);
		bool Is64Bit = (Opcode == AArch64_SBFMXri || Opcode == AArch64_UBFMXri);

		if (MCOperand_isImm(Op2) && MCOperand_getImm(Op2) == 0 && MCOperand_isImm(Op3)) {
			const char *AsmMnemonic = NULL;

			switch (MCOperand_getImm(Op3)) {
				default:
					break;
				case 7:
					if (IsSigned)
						AsmMnemonic = "sxtb";
					else if (!Is64Bit)
						AsmMnemonic = "uxtb";
					break;
				case 15:
					if (IsSigned)
						AsmMnemonic = "sxth";
					else if (!Is64Bit)
						AsmMnemonic = "uxth";
					break;
				case 31:
					// *xtw is only valid for signed 64-bit operations.
					if (Is64Bit && IsSigned)
						AsmMnemonic = "sxtw";
					break;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(getWRegFromXReg(MCOperand_getReg(Op1)), AArch64_NoRegAltName));

				if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
					uint8_t access;
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = getWRegFromXReg(MCOperand_getReg(Op1));
					MI->flat_insn->detail->arm64.op_count++;
				}

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				return;
			}
		}

		// All immediate shifts are aliases, implemented using the Bitfield
		// instruction. In all cases the immediate shift amount shift must be in
		// the range 0 to (reg.size -1).
		if (MCOperand_isImm(Op2) && MCOperand_isImm(Op3)) {
			const char *AsmMnemonic = NULL;
			int shift = 0;
			int immr = (int)MCOperand_getImm(Op2);
			int imms = (int)MCOperand_getImm(Op3);

			if (Opcode == AArch64_UBFMWri && imms != 0x1F && ((imms + 1) == immr)) {
				AsmMnemonic = "lsl";
				shift = 31 - imms;
			} else if (Opcode == AArch64_UBFMXri && imms != 0x3f &&
					((imms + 1 == immr))) {
				AsmMnemonic = "lsl";
				shift = 63 - imms;
			} else if (Opcode == AArch64_UBFMWri && imms == 0x1f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_UBFMXri && imms == 0x3f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMWri && imms == 0x1f) {
				AsmMnemonic = "asr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMXri && imms == 0x3f) {
				AsmMnemonic = "asr";
				shift = immr;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s, ", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));

				printInt32Bang(O, shift);

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
					uint8_t access;
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = shift;
					MI->flat_insn->detail->arm64.op_count++;
				}

				return;
			}
		}

		// SBFIZ/UBFIZ aliases
		if (MCOperand_getImm(Op2) > MCOperand_getImm(Op3)) {
			SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfiz" : "ubfiz"),
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
			printInt32Bang(O, (int)((Is64Bit ? 64 : 32) - MCOperand_getImm(Op2)));
			SStream_concat0(O, ", ");
			printInt32Bang(O, (int)MCOperand_getImm(Op3) + 1);

			MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfiz" : "ubfiz"));

			if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (Is64Bit ? 64 : 32) - (int)MCOperand_getImm(Op2);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op3) + 1;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		// Otherwise SBFX/UBFX is the preferred form
		SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfx" : "ubfx"),
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
		printInt32Bang(O, (int)MCOperand_getImm(Op2));
		SStream_concat0(O, ", ");
		printInt32Bang(O, (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1);

		MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfx" : "ubfx"));

		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op2);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op3) - MCOperand_getImm(Op2) + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	if (Opcode == AArch64_BFMXri || Opcode == AArch64_BFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0); // Op1 == Op0
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		int ImmR = (int)MCOperand_getImm(MCInst_getOperand(MI, 3));
		int ImmS = (int)MCOperand_getImm(MCInst_getOperand(MI, 4));

		// BFI alias
		if (ImmS < ImmR) {
			int BitWidth = Opcode == AArch64_BFMXri ? 64 : 32;
			LSB = (BitWidth - ImmR) % BitWidth;
			Width = ImmS + 1;

			SStream_concat(O, "bfi\t%s, %s, ",
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
			printInt32Bang(O, LSB);
			SStream_concat0(O, ", ");
			printInt32Bang(O, Width);
			MCInst_setOpcodePub(MI, AArch64_map_insn("bfi"));

			if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		LSB = ImmR;
		Width = ImmS - ImmR + 1;
		// Otherwise BFXIL the preferred form
		SStream_concat(O, "bfxil\t%s, %s, ",
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
		printInt32Bang(O, LSB);
		SStream_concat0(O, ", ");
		printInt32Bang(O, Width);
		MCInst_setOpcodePub(MI, AArch64_map_insn("bfxil"));

		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		MCInst_setOpcodePub(MI, AArch64_map_insn(mnem));
		cs_mem_free(mnem);
	} else {
		printInstruction(MI, O, Info);
	}
}